

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O0

int __thiscall WellFounded::getId(WellFounded *this,Lit l)

{
  pair<int,_int> *__x;
  pointer ppVar1;
  Lit in_ESI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_int>_>::value,_pair<iterator,_bool>_> _Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> p;
  vec<Lit> *this_00;
  uint local_34 [2];
  int local_2c;
  vec<Lit> local_28;
  undefined1 local_18;
  
  __x = (pair<int,_int> *)(in_RDI + 0xb8);
  local_2c = toInt(in_ESI);
  local_34[0] = vec<Lit>::size((vec<Lit> *)(in_RDI + 0x58));
  this_00 = &local_28;
  std::pair<int,_int>::pair<int,_unsigned_int,_true>((pair<int,_int> *)this_00,&local_2c,local_34);
  _Var2 = std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
          insert<std::pair<int,int>>
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     this_00,__x);
  local_28.data = (Lit *)_Var2.first._M_node;
  local_18 = _Var2.second;
  if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    vec<Lit>::push(this_00,(Lit *)__x);
  }
  ppVar1 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x2b6740);
  return ppVar1->second;
}

Assistant:

int getId(Lit l) {
		const std::pair<std::map<int, int>::iterator, bool> p =
				lit_to_index.insert(std::pair<int, int>(toInt(l), lits.size()));
		if (p.second) {
			lits.push(l);
		}
		return p.first->second;
	}